

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     AssignmentOperatorHelper<true,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute<false>(View<int,_false,_std::allocator<unsigned_long>_> *from,
                     View<int,_true,_std::allocator<unsigned_long>_> *to)

{
  size_t sVar1;
  unsigned_long *__dest;
  size_t sVar2;
  
  to->data_ = from->data_;
  if (from != (View<int,_false,_std::allocator<unsigned_long>_> *)to) {
    sVar2 = (from->geometry_).dimension_;
    __dest = (to->geometry_).shape_;
    sVar1 = (to->geometry_).dimension_;
    if (sVar2 != sVar1) {
      operator_delete(__dest,sVar1 * 0x18);
      sVar2 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar2;
      __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)&to->geometry_,sVar2 * 3,(void *)0x0);
      (to->geometry_).shape_ = __dest;
      sVar2 = (to->geometry_).dimension_;
      (to->geometry_).shapeStrides_ = __dest + sVar2;
      (to->geometry_).strides_ = __dest + sVar2 + sVar2;
      sVar2 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar2;
    }
    memcpy(__dest,(from->geometry_).shape_,sVar2 * 0x18);
    (to->geometry_).size_ = (from->geometry_).size_;
    (to->geometry_).coordinateOrder_ = (from->geometry_).coordinateOrder_;
    (to->geometry_).isSimple_ = (from->geometry_).isSimple_;
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, isConstFrom, AFrom>& from,
        View<TTo, true, ATo>& to
    )
    {
        Assert(MARRAY_NO_ARG_TEST || sizeof(TFrom) == sizeof(TTo));
        to.data_ = static_cast<const TTo*>(
            static_cast<const void*>(from.data_)); // copy pointer
        to.geometry_ = from.geometry_;
    }